

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
make_word<wchar_t,std::__cxx11::wstring>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,size_t length,wchar_t delim)

{
  initializer_list<wchar_t> __l;
  allocator<wchar_t> local_55;
  wchar_t local_54;
  iterator local_50;
  size_type local_48;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_40;
  wchar_t local_1c;
  size_t sStack_18;
  wchar_t delim_local;
  size_t length_local;
  
  local_50 = &local_54;
  local_48 = 1;
  local_54 = delim;
  local_1c = delim;
  sStack_18 = length;
  length_local = (size_t)__return_storage_ptr__;
  std::allocator<wchar_t>::allocator();
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::__cxx11::wstring::wstring((wstring *)&local_40,__l,&local_55);
  make_word<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_nullptr>
            (__return_storage_ptr__,&local_40,sStack_18);
  std::__cxx11::wstring::~wstring((wstring *)&local_40);
  std::allocator<wchar_t>::~allocator(&local_55);
  return __return_storage_ptr__;
}

Assistant:

ResultT make_word(size_t length = 8, T delim = default_delim<T>) {
	return make_word<T, ResultT>(std::basic_string<T>{ delim }, length);
}